

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mcpl.c
# Opt level: O0

void mcpl_update_nparticles(FILE *f,uint64_t n)

{
  int iVar1;
  long __off;
  size_t sVar2;
  FILE *in_RDI;
  size_t nb;
  int64_t savedpos;
  char *errmsg;
  undefined1 local_10 [8];
  FILE *local_8;
  
  local_8 = in_RDI;
  __off = ftell(in_RDI);
  if (__off < 0) {
    mcpl_error((char *)0x10445b);
  }
  iVar1 = fseek(local_8,8,0);
  if (iVar1 != 0) {
    mcpl_error((char *)0x10447b);
  }
  sVar2 = fwrite(local_10,1,8,local_8);
  if (sVar2 != 8) {
    mcpl_error((char *)0x1044a9);
  }
  iVar1 = fseek(local_8,__off,0);
  if (iVar1 != 0) {
    mcpl_error((char *)0x1044c9);
  }
  return;
}

Assistant:

MCPL_LOCAL void mcpl_update_nparticles(FILE* f, uint64_t n)
{
  //Seek and update nparticles at correct location in header:
  const char * errmsg = ( "Errors encountered while attempting "
                          "to update number of particles in file." );
  int64_t savedpos = MCPL_FTELL(f);
  if (savedpos<0)
    mcpl_error(errmsg);
  if (MCPL_FSEEK( f, MCPLIMP_NPARTICLES_POS ))
    mcpl_error(errmsg);
  size_t nb = fwrite(&n, 1, sizeof(n), f);
  if (nb != sizeof(n))
    mcpl_error(errmsg);
  if (MCPL_FSEEK( f, savedpos ))
    mcpl_error(errmsg);
}